

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O1

UInt32 Bt4_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit;
  CLzRef CVar1;
  CLzRef CVar2;
  CLzRef CVar3;
  byte *cur;
  CLzRef *pCVar4;
  uint uVar5;
  UInt32 UVar6;
  UInt32 *pUVar7;
  uint uVar8;
  byte *pbVar9;
  byte *pbVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  UInt32 UVar15;
  ulong uVar16;
  ulong uVar17;
  
  lenLimit = p->lenLimit;
  uVar11 = (ulong)lenLimit;
  if (uVar11 < 4) {
    MatchFinder_MovePos(p);
    return 0;
  }
  cur = p->buffer;
  uVar13 = (uint)cur[1] ^ p->crc[*cur];
  uVar5 = (uint)cur[2] << 8 ^ uVar13;
  uVar13 = uVar13 & 0x3ff;
  uVar16 = (ulong)(uVar5 & 0xffff);
  pCVar4 = p->hash;
  CVar1 = p->pos;
  CVar2 = pCVar4[uVar13];
  uVar8 = CVar1 - CVar2;
  CVar3 = pCVar4[uVar16 + 0x400];
  uVar5 = ((p->crc[cur[3]] << 5 ^ uVar5) & p->hashMask) + 0x10400;
  UVar6 = pCVar4[uVar5];
  pCVar4[uVar13] = CVar1;
  pCVar4[uVar16 + 0x400] = CVar1;
  pCVar4[uVar5] = CVar1;
  uVar16 = 0;
  if ((uVar8 < p->cyclicBufferSize) && (cur[-(ulong)uVar8] == *cur)) {
    *distances = 2;
    distances[1] = uVar8 - 1;
    uVar16 = 2;
  }
  iVar14 = (int)uVar16;
  uVar17 = uVar16;
  if (((CVar3 != CVar2) && (uVar5 = CVar1 - CVar3, uVar5 < p->cyclicBufferSize)) &&
     (cur[-(ulong)uVar5] == *cur)) {
    distances[uVar16 + 1] = uVar5 - 1;
    uVar16 = 3;
    uVar17 = (ulong)(iVar14 + 2);
    uVar8 = uVar5;
  }
  uVar5 = (uint)uVar16;
  UVar15 = (UInt32)uVar17;
  if (UVar15 != 0) {
    pbVar9 = cur + uVar16;
    pbVar10 = pbVar9;
    if (uVar5 != lenLimit) {
      lVar12 = uVar11 - uVar16;
      do {
        pbVar10 = pbVar9;
        if (pbVar9[-(ulong)uVar8] != *pbVar9) break;
        pbVar9 = pbVar9 + 1;
        lVar12 = lVar12 + -1;
        pbVar10 = cur + uVar11;
      } while (lVar12 != 0);
    }
    uVar5 = (int)pbVar10 - (int)cur;
    distances[UVar15 - 2] = uVar5;
    if (lenLimit == uVar5) {
      SkipMatchesSpec(lenLimit,UVar6,p->pos,cur,p->son,p->cyclicBufferPos,p->cyclicBufferSize,
                      p->cutValue);
      goto LAB_0011322f;
    }
  }
  UVar15 = 3;
  if (3 < uVar5) {
    UVar15 = uVar5;
  }
  pUVar7 = GetMatchesSpec1(lenLimit,UVar6,p->pos,cur,p->son,p->cyclicBufferPos,p->cyclicBufferSize,
                           p->cutValue,distances + uVar17,UVar15);
  UVar15 = (UInt32)((ulong)((long)pUVar7 - (long)distances) >> 2);
LAB_0011322f:
  p->cyclicBufferPos = p->cyclicBufferPos + 1;
  p->buffer = p->buffer + 1;
  UVar6 = p->pos + 1;
  p->pos = UVar6;
  if (UVar6 == p->posLimit) {
    MatchFinder_CheckLimits(p);
  }
  return UVar15;
}

Assistant:

static UInt32 Bt4_MatchFinder_GetMatches(CMatchFinder *p, UInt32 *distances)
{
  UInt32 h2, h3, d2, d3, maxLen, offset, pos;
  UInt32 *hash;
  GET_MATCHES_HEADER(4)

  HASH4_CALC;

  hash = p->hash;
  pos = p->pos;

  d2 = pos - hash[                h2];
  d3 = pos - hash[kFix3HashSize + h3];

  curMatch = hash[kFix4HashSize + hv];

  hash[                h2] = pos;
  hash[kFix3HashSize + h3] = pos;
  hash[kFix4HashSize + hv] = pos;

  maxLen = 0;
  offset = 0;
  
  if (d2 < p->cyclicBufferSize && *(cur - d2) == *cur)
  {
    distances[0] = maxLen = 2;
    distances[1] = d2 - 1;
    offset = 2;
  }
  
  if (d2 != d3 && d3 < p->cyclicBufferSize && *(cur - d3) == *cur)
  {
    maxLen = 3;
    distances[offset + 1] = d3 - 1;
    offset += 2;
    d2 = d3;
  }
  
  if (offset != 0)
  {
    UPDATE_maxLen
    distances[offset - 2] = maxLen;
    if (maxLen == lenLimit)
    {
      SkipMatchesSpec(lenLimit, curMatch, MF_PARAMS(p));
      MOVE_POS_RET;
    }
  }
  
  if (maxLen < 3)
    maxLen = 3;
  
  GET_MATCHES_FOOTER(offset, maxLen)
}